

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

Status cmSystemTools::MakeTempDirectory(char *path,mode_t *mode)

{
  bool bVar1;
  char *pcVar2;
  mode_t *local_40;
  char *sep;
  size_t local_28;
  size_t l;
  mode_t *mode_local;
  char *path_local;
  
  l = (size_t)mode;
  mode_local = (mode_t *)path;
  if (path == (char *)0x0) {
    path_local = (char *)cmsys::Status::POSIX(0x16);
  }
  else {
    local_28 = strlen(path);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&sep,(char *)mode_local,local_28)
    ;
    bVar1 = cmHasLiteralSuffix<7ul>(_sep,(char (*) [7])0xd6a992);
    if (bVar1) {
      local_40 = mode_local;
      while( true ) {
        pcVar2 = strchr((char *)local_40,0x2f);
        if (pcVar2 == (char *)0x0) break;
        *pcVar2 = '\0';
        Mkdir((char *)mode_local,(mode_t *)l);
        *pcVar2 = '/';
        local_40 = (mode_t *)(pcVar2 + 1);
      }
      pcVar2 = mkdtemp((char *)mode_local);
      if (pcVar2 == (char *)0x0) {
        path_local = (char *)cmsys::Status::POSIX_errno();
      }
      else {
        if (l != 0) {
          chmod((char *)mode_local,*(__mode_t *)l);
        }
        path_local = (char *)cmsys::Status::Success();
      }
    }
    else {
      path_local = (char *)cmsys::Status::POSIX(0x16);
    }
  }
  return (Status)path_local;
}

Assistant:

cmsys::Status cmSystemTools::MakeTempDirectory(char* path, const mode_t* mode)
{
  if (!path) {
    return cmsys::Status::POSIX(EINVAL);
  }

  // verify that path ends with "XXXXXX"
  const auto l = std::strlen(path);
  if (!cmHasLiteralSuffix(cm::string_view{ path, l }, "XXXXXX")) {
    return cmsys::Status::POSIX(EINVAL);
  }

  // create parent directories
  auto* sep = path;
  while ((sep = strchr(sep, '/'))) {
    // all underlying functions use C strings,
    // so temporarily end the string here
    *sep = '\0';
    Mkdir(path, mode);

    *sep = '/';
    ++sep;
  }

#ifdef _WIN32
  const int nchars = 36;
  const char chars[nchars + 1] = "abcdefghijklmnopqrstuvwxyz0123456789";

  std::random_device rd;
  std::mt19937 rg{ rd() };
  std::uniform_int_distribution<int> dist{ 0, nchars - 1 };

  for (auto tries = 100; tries; --tries) {
    for (auto n = l - 6; n < l; ++n) {
      path[n] = chars[dist(rg)];
    }
    if (Mkdir(path, mode) == 0) {
      return cmsys::Status::Success();
    } else if (errno != EEXIST) {
      return cmsys::Status::POSIX_errno();
    }
  }
  return cmsys::Status::POSIX(EAGAIN);
#else
  if (mkdtemp(path)) {
    if (mode) {
      chmod(path, *mode);
    }
  } else {
    return cmsys::Status::POSIX_errno();
  }
  return cmsys::Status::Success();
#endif
}